

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Preface::Copy(Preface *this,Preface *rhs)

{
  Preface *rhs_local;
  Preface *this_local;
  
  InterchangeObject::Copy(&this->super_InterchangeObject,&rhs->super_InterchangeObject);
  Kumu::Timestamp::operator=(&this->LastModifiedDate,&rhs->LastModifiedDate);
  this->Version = rhs->Version;
  (this->ObjectModelVersion).m_property = (rhs->ObjectModelVersion).m_property;
  (this->ObjectModelVersion).m_has_value = (rhs->ObjectModelVersion).m_has_value;
  optional_property<Kumu::UUID>::operator=(&this->PrimaryPackage,&rhs->PrimaryPackage);
  Array<Kumu::UUID>::operator=(&this->Identifications,&rhs->Identifications);
  Kumu::UUID::operator=(&this->ContentStorage,&rhs->ContentStorage);
  UL::operator=(&this->OperationalPattern,&rhs->OperationalPattern);
  Batch<ASDCP::UL>::operator=(&this->EssenceContainers,&rhs->EssenceContainers);
  Batch<ASDCP::UL>::operator=(&this->DMSchemes,&rhs->DMSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::operator=
            (&this->ApplicationSchemes,&rhs->ApplicationSchemes);
  optional_property<ASDCP::MXF::Batch<ASDCP::UL>_>::operator=
            (&this->ConformsToSpecifications,&rhs->ConformsToSpecifications);
  return;
}

Assistant:

void
ASDCP::MXF::Preface::Copy(const Preface& rhs)
{
  InterchangeObject::Copy(rhs);

  LastModifiedDate = rhs.LastModifiedDate;
  Version = rhs.Version;
  ObjectModelVersion = rhs.ObjectModelVersion;
  PrimaryPackage = rhs.PrimaryPackage;
  Identifications = rhs.Identifications;
  ContentStorage = rhs.ContentStorage;
  OperationalPattern = rhs.OperationalPattern;
  EssenceContainers = rhs.EssenceContainers;
  DMSchemes = rhs.DMSchemes;
  ApplicationSchemes = rhs.ApplicationSchemes;
  ConformsToSpecifications = rhs.ConformsToSpecifications;
}